

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_moving_multiscale
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL *displaced,REF_DBL *scalar,
          REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
          REF_DBL complexity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  REF_GLOB *pRVar3;
  double dVar4;
  uint uVar5;
  REF_DBL *hessian;
  void *__ptr;
  REF_DBL *pRVar6;
  REF_DBL *pRVar7;
  long *plVar8;
  long lVar9;
  void *__ptr_00;
  REF_NODE pRVar10;
  REF_DBL *pRVar11;
  void *pvVar12;
  undefined8 uVar13;
  ulong uVar14;
  REF_NODE pRVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  REF_DBL *pRVar20;
  char *pcVar21;
  REF_STATUS RVar22;
  undefined4 uVar23;
  REF_DBL det;
  double local_38;
  
  pRVar10 = ref_grid->node;
  uVar17 = (ulong)(uint)pRVar10->max;
  if (pRVar10->max < 0) {
    pcVar21 = "malloc hess of REF_DBL negative";
    uVar13 = 0x9c8;
LAB_001e7eb3:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar13
           ,"ref_metric_moving_multiscale",pcVar21);
    RVar22 = 1;
  }
  else {
    hessian = (REF_DBL *)malloc(uVar17 * 0x30);
    if (hessian == (REF_DBL *)0x0) {
      pcVar21 = "malloc hess of REF_DBL NULL";
      uVar13 = 0x9c8;
    }
    else {
      __ptr = malloc(uVar17 * 0x48);
      if (__ptr == (void *)0x0) {
        pcVar21 = "malloc jac of REF_DBL NULL";
        uVar13 = 0x9c9;
      }
      else {
        pRVar6 = (REF_DBL *)malloc(uVar17 * 8);
        if (pRVar6 == (REF_DBL *)0x0) {
          pcVar21 = "malloc x of REF_DBL NULL";
          uVar13 = 0x9ca;
        }
        else {
          pRVar7 = (REF_DBL *)malloc(uVar17 * 0x18);
          if (pRVar7 == (REF_DBL *)0x0) {
            pcVar21 = "malloc grad of REF_DBL NULL";
            uVar13 = 0x9cb;
          }
          else {
            uVar14 = 0;
            lVar9 = 0;
            pRVar15 = pRVar10;
            pRVar20 = displaced;
            do {
              if (0 < (int)uVar17) {
                pRVar3 = pRVar15->global;
                uVar18 = 0;
                pRVar11 = pRVar20;
                do {
                  if (-1 < pRVar3[uVar18]) {
                    pRVar6[uVar18] = *pRVar11;
                  }
                  uVar18 = uVar18 + 1;
                  pRVar11 = pRVar11 + 3;
                } while (uVar17 != uVar18);
              }
              uVar5 = ref_recon_gradient(ref_grid,pRVar6,pRVar7,reconstruction);
              if (uVar5 != 0) {
                pcVar21 = "recon x";
                uVar13 = 0x9d1;
                goto LAB_001e7f92;
              }
              pRVar15 = ref_grid->node;
              uVar5 = pRVar15->max;
              uVar17 = (ulong)uVar5;
              if (ref_grid->twod == 0) {
LAB_001e7d33:
                if (0 < (int)uVar5) {
                  plVar8 = pRVar15->global;
                  uVar16 = 0;
                  uVar18 = uVar14;
                  do {
                    if (-1 < *plVar8) {
                      *(undefined8 *)((long)__ptr + (uVar18 & 0x7fffffff8) + 0x10) =
                           *(undefined8 *)((long)pRVar7 + (uVar16 & 0x7fffffff8) + 0x10);
                      puVar2 = (undefined8 *)((long)pRVar7 + (uVar16 & 0x7fffffff8));
                      uVar13 = puVar2[1];
                      puVar1 = (undefined8 *)((long)__ptr + (uVar18 & 0x7fffffff8));
                      *puVar1 = *puVar2;
                      puVar1[1] = uVar13;
                    }
                    uVar16 = uVar16 + 0x18;
                    uVar18 = uVar18 + 0x48;
                    plVar8 = plVar8 + 1;
                  } while (uVar17 * 0x18 != uVar16);
                }
              }
              else if (0 < (int)uVar5) {
                pRVar3 = pRVar15->global;
                uVar18 = 0;
                pRVar11 = pRVar7 + 2;
                do {
                  if (-1 < pRVar3[uVar18]) {
                    *pRVar11 = 1.0;
                  }
                  uVar18 = uVar18 + 1;
                  pRVar11 = pRVar11 + 3;
                } while (uVar17 != uVar18);
                goto LAB_001e7d33;
              }
              lVar9 = lVar9 + 1;
              pRVar20 = pRVar20 + 1;
              uVar14 = uVar14 + 0x18;
            } while (lVar9 != 3);
            free(pRVar7);
            free(pRVar6);
            uVar17 = (ulong)(uint)pRVar15->max;
            if (pRVar15->max < 0) {
              pcVar21 = "malloc xyz of REF_DBL negative";
              uVar13 = 0x9e0;
              goto LAB_001e7eb3;
            }
            __ptr_00 = malloc(uVar17 * 0x18);
            if (__ptr_00 != (void *)0x0) {
              if (uVar17 != 0) {
                pRVar3 = pRVar15->global;
                lVar9 = 0;
                uVar14 = 0;
                pvVar12 = __ptr_00;
                do {
                  if (-1 < pRVar3[uVar14]) {
                    pRVar6 = pRVar10->real;
                    lVar19 = 0;
                    do {
                      *(undefined8 *)((long)pvVar12 + lVar19 * 8) =
                           *(undefined8 *)((long)pRVar6 + lVar19 * 8 + lVar9);
                      *(REF_DBL *)((long)pRVar6 + lVar19 * 8 + lVar9) = displaced[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                  }
                  uVar14 = uVar14 + 1;
                  lVar9 = lVar9 + 0x78;
                  displaced = displaced + 3;
                  pvVar12 = (void *)((long)pvVar12 + 0x18);
                } while (uVar14 != uVar17);
              }
              uVar5 = ref_recon_hessian(ref_grid,scalar,hessian,reconstruction);
              if (uVar5 == 0) {
                lVar9 = (long)ref_grid->node->max;
                if (0 < lVar9) {
                  pRVar3 = ref_grid->node->global;
                  lVar19 = 0;
                  do {
                    if (-1 < pRVar3[lVar19]) {
                      uVar17 = lVar19 * 0x18 & 0x7fffffff8;
                      uVar14 = lVar19 * 0x78 & 0x7fffffff8;
                      pRVar6 = pRVar10->real;
                      *(undefined8 *)((long)pRVar6 + uVar14 + 0x10) =
                           *(undefined8 *)((long)__ptr_00 + uVar17 + 0x10);
                      puVar2 = (undefined8 *)((long)__ptr_00 + uVar17);
                      uVar13 = puVar2[1];
                      puVar1 = (undefined8 *)((long)pRVar6 + uVar14);
                      *puVar1 = *puVar2;
                      puVar1[1] = uVar13;
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != lVar9);
                }
                free(__ptr_00);
                uVar5 = ref_recon_roundoff_limit(hessian,ref_grid);
                if (uVar5 == 0) {
                  pRVar10 = ref_grid->node;
                  if (0 < pRVar10->max) {
                    lVar9 = 0;
                    pRVar6 = metric;
                    do {
                      if (-1 < pRVar10->global[lVar9]) {
                        pRVar7 = (REF_DBL *)((long)__ptr + lVar9 * 0x48);
                        uVar5 = ref_matrix_jac_m_jact(pRVar7,hessian + lVar9 * 6,metric + lVar9 * 6)
                        ;
                        if (uVar5 != 0) {
                          pcVar21 = "J M J^t";
                          uVar13 = 0x9f4;
                          goto LAB_001e7f92;
                        }
                        uVar5 = ref_matrix_det_gen(3,pRVar7,&local_38);
                        if (uVar5 != 0) {
                          pcVar21 = "gen det";
                          uVar13 = 0x9f6;
                          goto LAB_001e7f92;
                        }
                        lVar19 = 0;
                        do {
                          uVar23 = (undefined4)((ulong)local_38 >> 0x20);
                          if (local_38 <= -local_38) {
                            uVar23 = (undefined4)((ulong)-local_38 >> 0x20);
                          }
                          dVar4 = pow((double)CONCAT44(uVar23,SUB84(local_38,0)),
                                      1.0 / (double)p_norm);
                          pRVar6[lVar19] = dVar4 * pRVar6[lVar19];
                          lVar19 = lVar19 + 1;
                        } while (lVar19 != 6);
                        pRVar10 = ref_grid->node;
                      }
                      lVar9 = lVar9 + 1;
                      pRVar6 = pRVar6 + 6;
                    } while (lVar9 < pRVar10->max);
                  }
                  free(__ptr);
                  free(hessian);
                  uVar5 = ref_metric_local_scale(metric,ref_grid,p_norm);
                  if (uVar5 == 0) {
                    uVar5 = ref_metric_gradation_at_complexity(metric,ref_grid,gradation,complexity)
                    ;
                    if (uVar5 == 0) {
                      return 0;
                    }
                    pcVar21 = "gradation at complexity";
                    uVar13 = 0xa01;
                  }
                  else {
                    pcVar21 = "local scale lp norm";
                    uVar13 = 0x9fe;
                  }
                }
                else {
                  pcVar21 = "floor metric eigenvalues based on grid size and solution jitter";
                  uVar13 = 0x9f0;
                }
              }
              else {
                pcVar21 = "recon";
                uVar13 = 0x9e7;
              }
LAB_001e7f92:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,uVar13,"ref_metric_moving_multiscale",(ulong)uVar5,pcVar21);
              return uVar5;
            }
            pcVar21 = "malloc xyz of REF_DBL NULL";
            uVar13 = 0x9e0;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar13
           ,"ref_metric_moving_multiscale",pcVar21);
    RVar22 = 2;
  }
  return RVar22;
}

Assistant:

REF_FCN REF_STATUS ref_metric_moving_multiscale(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL *displaced, REF_DBL *scalar,
    REF_RECON_RECONSTRUCTION reconstruction, REF_INT p_norm, REF_DBL gradation,
    REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *jac, *x, *grad, *hess, *xyz, det;
  REF_INT i, j, node;
  ref_malloc(hess, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(jac, 9 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(x, ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(grad, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  for (j = 0; j < 3; j++) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      x[node] = displaced[j + 3 * node];
    }
    RSS(ref_recon_gradient(ref_grid, x, grad, reconstruction), "recon x");
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        grad[2 + 3 * node] = 1.0;
      }
    }
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      for (i = 0; i < 3; i++) {
        jac[i + 3 * j + 9 * node] = grad[i + 3 * node];
      }
    }
  }
  ref_free(grad);
  ref_free(x);

  ref_malloc(xyz, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 3; i++) {
      xyz[i + 3 * node] = ref_node_xyz(ref_node, i, node);
      ref_node_xyz(ref_node, i, node) = displaced[i + 3 * node];
    }
  }
  RSS(ref_recon_hessian(ref_grid, scalar, hess, reconstruction), "recon");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 3; i++) {
      ref_node_xyz(ref_node, i, node) = xyz[i + 3 * node];
    }
  }
  ref_free(xyz);

  RSS(ref_recon_roundoff_limit(hess, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_jac_m_jact(&(jac[9 * node]), &(hess[6 * node]),
                              &(metric[6 * node])),
        "J M J^t");

    RSS(ref_matrix_det_gen(3, &(jac[9 * node]), &det), "gen det");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *= pow(ABS(det), 1.0 / (REF_DBL)p_norm);
    }
  }
  ref_free(jac);
  ref_free(hess);

  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}